

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void child_function(void)

{
  fdb_config fconfig;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char bodybuf [512];
  char keybuf [256];
  int i;
  fdb_file_handle *fhandle;
  size_t in_stack_fffffffffffffbd8;
  void *in_stack_fffffffffffffbe0;
  size_t in_stack_fffffffffffffbe8;
  void *in_stack_fffffffffffffbf0;
  fdb_kvs_handle *in_stack_fffffffffffffbf8;
  fdb_file_handle *local_318;
  char local_308 [104];
  fdb_kvs_config *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  fdb_kvs_handle **in_stack_fffffffffffffd70;
  fdb_file_handle *in_stack_fffffffffffffd78;
  fdb_config *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  fdb_file_handle **in_stack_fffffffffffffde8;
  char local_108 [260];
  uint local_4;
  
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fdb_open(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  fdb_kvs_open(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd60);
  local_4 = 0;
  do {
    sprintf(local_108,"key%d",(ulong)local_4);
    sprintf(local_308,"seqno%d",(ulong)local_4);
    fhandle = local_318;
    strlen(local_108);
    strlen(local_308);
    fdb_set_kv(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    if ((int)local_4 % 100 == 0) {
      if ((int)local_4 % 500 == 0) {
        fdb_commit(fhandle,'\0');
      }
      else {
        fdb_commit(fhandle,'\0');
      }
    }
    local_4 = local_4 + 1;
  } while( true );
}

Assistant:

void child_function() {
    int i;
    char keybuf[256];
    char bodybuf[512];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = 5;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db", &kvs_config);

    // load docs into db and db2
    i = 0;
    while (true) {
        sprintf(keybuf, "key%d",i);
        sprintf(bodybuf, "seqno%d",i);
        fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        // create seqno every 100 updates
        if ((i % 100) == 0) {
            if ((i % 500) == 0) { // wal flush every 500 updates
                fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
            } else {
                fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            }
        }
        i++;
    }
}